

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O3

void __thiscall tcu::x11::XcbWindow::setDimensions(XcbWindow *this,int width,int height)

{
  xcb_connection_t *pxVar1;
  byte *ptr;
  int h;
  int w;
  uint32_t values [2];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pxVar1 = this->m_display->m_connection;
  local_38 = width;
  local_34 = height;
  xcb_configure_window(pxVar1,this->m_window,0xc);
  xcb_flush(pxVar1);
  do {
    ptr = (byte *)xcb_poll_for_event(pxVar1);
    if (ptr != (byte *)0x0) {
      if (((*ptr & 0x7f) == 0x1c) && (*(int *)(ptr + 8) == 0x3c)) {
        deFree(ptr);
        return;
      }
      deFree(ptr);
    }
    (*(this->super_WindowBase)._vptr_WindowBase[5])(this,&local_3c,&local_40);
    if (local_40 == height) {
      return;
    }
  } while (local_3c != width);
  return;
}

Assistant:

void XcbWindow::setDimensions (int width, int height)
{
	const uint32_t		values[]	= {static_cast<uint32_t >(width), static_cast<uint32_t >(height)};
	xcb_void_cookie_t	result;
	xcb_connection_t*	display		= m_display.getConnection();
	result = xcb_configure_window(display, m_window, XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT, values);
	DE_ASSERT(DE_NULL == xcb_request_check(display,result));
	xcb_flush (display);

	for(;;)
	{
		xcb_generic_event_t*	event = xcb_poll_for_event(display);
		int						w, h;
		if(event != DE_NULL)
		{
			if (XCB_PROPERTY_NOTIFY == (event->response_type & ~0x80))
			{
				const xcb_property_notify_event_t* pnEvent = (xcb_property_notify_event_t*)event;
				if (pnEvent->atom == XCB_ATOM_RESOLUTION)
				{
					deFree(event);
					break;
				}
			}
			deFree(event);
		}
		getDimensions (&w,&h);
		if (h==height || w==width)
			break;
	}
}